

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle-allocator.hh
# Opt level: O3

bool __thiscall
tinyusdz::HandleAllocator<unsigned_long>::Release
          (HandleAllocator<unsigned_long> *this,unsigned_long handle)

{
  iterator __position;
  unsigned_long local_10;
  
  if (this->counter_ - 1 == handle) {
    if (this->counter_ < 2) {
      return false;
    }
    this->counter_ = handle;
  }
  else {
    if (handle == 0) {
      return false;
    }
    __position._M_current =
         (this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_10 = handle;
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,__position,&local_10);
    }
    else {
      *__position._M_current = handle;
      (this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->dirty_ = true;
  }
  return true;
}

Assistant:

bool Release(const T handle) {
    if (handle == counter_ - static_cast<T>(1)) {
      if (counter_ > static_cast<T>(1)) {
        counter_--;
      } else {
        return false;
      }
    } else {
      if (handle >= static_cast<T>(1)) {
        freeList_.push_back(handle);
        // Delay sort until required
        dirty_ = true;
      } else {
        // invalid handle
        return false;
      }
    }

    return true;
  }